

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::returnPressed(QComboBoxPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QComboBoxPrivate *pQVar4;
  ulong uVar5;
  QComboBox *this_00;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int index;
  QComboBox *q;
  QString text;
  QString *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  uint in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QComboBoxPrivate *in_stack_fffffffffffffee0;
  QComboBox *in_stack_fffffffffffffee8;
  QComboBoxPrivate *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  byte bVar6;
  byte bVar7;
  undefined4 in_stack_ffffffffffffff08;
  int local_e8;
  QPersistentModelIndex local_d0 [12];
  QPersistentModelIndex local_70 [3];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QComboBoxPrivate *)q_func(in_RDI);
  if (in_RDI->insertPolicy == NoInsert) goto LAB_0053743b;
  bVar6 = 0;
  bVar7 = bVar6;
  if (in_RDI->lineEdit != (QLineEdit *)0x0) {
    QLineEdit::text((QLineEdit *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    bVar1 = QString::isEmpty((QString *)0x537053);
    bVar6 = bVar1 ^ 0xff;
    bVar7 = bVar6;
    QString::~QString((QString *)0x537077);
  }
  if (((bVar6 & 1) == 0) ||
     ((iVar2 = QComboBox::count((QComboBox *)in_stack_fffffffffffffee0), in_RDI->maxCount <= iVar2
      && (in_RDI->insertPolicy != InsertAtCurrent)))) goto LAB_0053743b;
  QLineEdit::deselect((QLineEdit *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  QLineEdit::end((QLineEdit *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QLineEdit *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (((byte)in_RDI->field_0x34c >> 1 & 1) == 0) {
    in_stack_fffffffffffffef0 = pQVar4;
    matchFlags((QComboBoxPrivate *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    iVar2 = QComboBox::findText((QComboBox *)in_stack_fffffffffffffee0,
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                (QFlagsStorageHelper<Qt::MatchFlag,_4>)
                                SUB84((ulong)in_stack_fffffffffffffee8 >> 0x20,0));
    if (iVar2 == -1) goto LAB_005371b8;
    QComboBox::setCurrentIndex
              (in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
    emitActivated(in_stack_fffffffffffffee0,
                  (QModelIndex *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  else {
LAB_005371b8:
    local_e8 = -1;
    this_00 = (QComboBox *)(ulong)(in_RDI->insertPolicy - InsertAtTop);
    switch(this_00) {
    case (QComboBox *)0x0:
      local_e8 = 0;
      break;
    case (QComboBox *)0x1:
    case (QComboBox *)0x3:
    case (QComboBox *)0x4:
      iVar2 = QComboBox::count((QComboBox *)in_stack_fffffffffffffee0);
      if ((iVar2 == 0) || (uVar5 = QPersistentModelIndex::isValid(), (uVar5 & 1) == 0)) {
        local_e8 = 0;
      }
      else if (in_RDI->insertPolicy == InsertAtCurrent) {
        QComboBox::currentIndex
                  ((QComboBox *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        QComboBox::setItemText
                  ((QComboBox *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_fffffffffffffef8)),
                   (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(QString *)this_00);
        in_stack_fffffffffffffee0 = pQVar4;
      }
      else if (in_RDI->insertPolicy == InsertAfterCurrent) {
        local_e8 = QComboBox::currentIndex
                             ((QComboBox *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        local_e8 = local_e8 + 1;
      }
      else if (in_RDI->insertPolicy == InsertBeforeCurrent) {
        local_e8 = QComboBox::currentIndex
                             ((QComboBox *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      }
      break;
    case (QComboBox *)0x2:
      local_e8 = QComboBox::count((QComboBox *)in_stack_fffffffffffffee0);
      break;
    case (QComboBox *)0x5:
      local_e8 = 0;
      in_stack_fffffffffffffedc = 0;
      while (iVar2 = in_stack_fffffffffffffedc,
            iVar3 = QComboBox::count((QComboBox *)in_stack_fffffffffffffee0),
            in_stack_fffffffffffffedc < iVar3) {
        QString::toLower(in_stack_fffffffffffffec8);
        QComboBox::itemText((QComboBox *)CONCAT44(iVar2,in_stack_ffffffffffffff08),
                            (int)((ulong)in_RDI >> 0x20));
        QString::toLower(in_stack_fffffffffffffec8);
        bVar1 = ::operator<((QString *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                            ,in_stack_fffffffffffffec8);
        in_stack_fffffffffffffed8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed8);
        QString::~QString((QString *)0x53734f);
        QString::~QString((QString *)0x53735c);
        QString::~QString((QString *)0x537369);
        if ((in_stack_fffffffffffffed8 & 0x1000000) != 0) break;
        in_stack_fffffffffffffedc = iVar2 + 1;
        local_e8 = local_e8 + 1;
      }
    }
    if (-1 < local_e8) {
      ::QVariant::QVariant((QVariant *)0x5373bb);
      QComboBox::insertItem
                ((QComboBox *)in_stack_fffffffffffffef0,(int)((ulong)this_00 >> 0x20),
                 (QString *)in_stack_fffffffffffffee0,
                 (QVariant *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      ::QVariant::~QVariant(&local_28);
      QComboBox::setCurrentIndex(this_00,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_d0);
      emitActivated(in_stack_fffffffffffffee0,
                    (QModelIndex *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
  }
  QString::~QString((QString *)0x53742d);
LAB_0053743b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::returnPressed()
{
    Q_Q(QComboBox);

    // The insertion code below does not apply when the policy is QComboBox::NoInsert.
    // In case a completer is installed, item activation via the completer is handled
    // in completerActivated(). Otherwise editingFinished() updates the current
    // index as appropriate.
    if (insertPolicy == QComboBox::NoInsert)
        return;

    if (lineEdit && !lineEdit->text().isEmpty()) {
        if (q->count() >= maxCount && !(this->insertPolicy == QComboBox::InsertAtCurrent))
            return;
        lineEdit->deselect();
        lineEdit->end(false);
        QString text = lineEdit->text();
        // check for duplicates (if not enabled) and quit
        int index = -1;
        if (!duplicatesEnabled) {
            index = q->findText(text, matchFlags());
            if (index != -1) {
                q->setCurrentIndex(index);
                emitActivated(currentIndex);
                return;
            }
        }
        switch (insertPolicy) {
        case QComboBox::InsertAtTop:
            index = 0;
            break;
        case QComboBox::InsertAtBottom:
            index = q->count();
            break;
        case QComboBox::InsertAtCurrent:
        case QComboBox::InsertAfterCurrent:
        case QComboBox::InsertBeforeCurrent:
            if (!q->count() || !currentIndex.isValid())
                index = 0;
            else if (insertPolicy == QComboBox::InsertAtCurrent)
                q->setItemText(q->currentIndex(), text);
            else if (insertPolicy == QComboBox::InsertAfterCurrent)
                index = q->currentIndex() + 1;
            else if (insertPolicy == QComboBox::InsertBeforeCurrent)
                index = q->currentIndex();
            break;
        case QComboBox::InsertAlphabetically:
            index = 0;
            for (int i = 0; i < q->count(); ++i, ++index) {
                if (text.toLower() < q->itemText(i).toLower())
                    break;
            }
            break;
        default:
            break;
        }
        if (index >= 0) {
            q->insertItem(index, text);
            q->setCurrentIndex(index);
            emitActivated(currentIndex);
        }
    }
}